

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

double __thiscall
chrono::fea::ChElementShellANCF_3833::GetVonMissesStress
          (ChElementShellANCF_3833 *this,double layer,double xi,double eta,double layer_zeta)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChKblockGeneric *pCVar31;
  double *pdVar32;
  Index row;
  ChElementShellANCF_3833 *this_00;
  pointer pLVar33;
  ActualDstType actualDst;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  double dVar52;
  undefined1 auVar53 [16];
  double dVar60;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_3,_3> SPK2;
  ChMatrix33<double> S;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  undefined1 local_950 [16];
  Matrix<double,_3,_3,_0,_3,_3> local_940;
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  double local_8c0 [6];
  undefined1 local_890 [16];
  undefined1 local_880 [40];
  undefined1 auStack_858 [16];
  double dStack_848;
  double dStack_840;
  ChMatrix33<double> local_838;
  Matrix<double,_3,_3,_0,_3,_3> *local_7f0;
  undefined1 *local_7e8;
  Matrix<double,_3,_3,_0,_3,_3> *local_7e0;
  double local_7d0;
  undefined1 local_7c0 [584];
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  undefined1 local_500 [16];
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  MatrixNx3c *local_4b0;
  Matrix<double,_3,_3,_1,_3,_3> *local_4a8;
  double local_4a0;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar49._8_56_ = in_register_00001208;
  auVar49._0_8_ = layer;
  lVar34 = vcvttsd2usi_avx512f(auVar49._0_16_);
  dVar52 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar34].m_thickness;
  Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,xi,eta,layer_zeta,dVar52,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar34] - this->m_thicknessZ * 0.5) +
             dVar52 * 0.5 + this->m_midsurfoffset);
  local_500._0_8_ = 1.0;
  local_540 = 0.0;
  local_7c0._576_8_ = 0.0;
  dStack_578 = 0.0;
  dStack_570 = 0.0;
  dStack_568 = 0.0;
  dStack_560 = 0.0;
  dStack_558 = 0.0;
  dStack_550 = 0.0;
  dStack_548 = 0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)(local_7c0 + 0x240),&this->m_ebar0,
             (MatrixNx3c *)local_2c0,(Scalar *)local_500);
  local_7c0._0_8_ = (MatrixNx3c *)local_2c0;
  local_7c0._8_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(local_7c0 + 0x240);
  local_500._0_8_ = (MatrixNx3c *)local_2c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8),(SrcXprType *)(local_7c0 + 8),
        (assign_op<double,_double> *)&local_940);
  local_4b0 = (MatrixNx3c *)local_500._0_8_;
  local_4a0 = 1.48219693752374e-323;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_500._8_8_;
  auVar38 = vbroadcastsd_avx512f(auVar35);
  auVar49 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array;
  auVar50 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 8);
  auVar51 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_4e0;
  auVar39 = vbroadcastsd_avx512f(auVar9);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar5 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x28);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_4f0;
  auVar40 = vbroadcastsd_avx512f(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_4c8;
  auVar41 = vbroadcastsd_avx512f(auVar37);
  auVar6 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x30);
  auVar7 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x38);
  auVar8 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x40);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_4d8;
  auVar42 = vbroadcastsd_avx512f(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_4d0;
  auVar43 = vbroadcastsd_avx512f(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_4c0;
  auVar44 = vbroadcastsd_avx512f(auVar12);
  auVar45 = vmulpd_avx512f(auVar49,auVar38);
  auVar46 = vmulpd_avx512f(auVar38,auVar50);
  auVar38 = vmulpd_avx512f(auVar38,auVar51);
  auVar47 = vmulpd_avx512f(auVar49,auVar40);
  auVar48 = vmulpd_avx512f(auVar50,auVar40);
  auVar45 = vfmadd231pd_avx512f(auVar45,auVar3,auVar39);
  auVar46 = vfmadd231pd_avx512f(auVar46,auVar4,auVar39);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar5,auVar39);
  auVar39 = vfmadd231pd_avx512f(auVar47,auVar3,auVar42);
  auVar47 = vfmadd231pd_avx512f(auVar48,auVar4,auVar42);
  local_2c0 = vfmadd231pd_avx512f(auVar45,auVar6,auVar41);
  local_280 = vfmadd231pd_avx512f(auVar46,auVar7,auVar41);
  local_240 = vfmadd231pd_avx512f(auVar38,auVar8,auVar41);
  auVar38 = vmulpd_avx512f(auVar51,auVar40);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_4b8;
  auVar40 = vbroadcastsd_avx512f(auVar13);
  local_200 = vfmadd231pd_avx512f(auVar39,auVar6,auVar44);
  local_1c0 = vfmadd231pd_avx512f(auVar47,auVar7,auVar44);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar5,auVar42);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_4e8;
  auVar39 = vbroadcastsd_avx512f(auVar14);
  local_180 = vfmadd231pd_avx512f(auVar38,auVar8,auVar44);
  auVar49 = vmulpd_avx512f(auVar49,auVar39);
  auVar50 = vmulpd_avx512f(auVar50,auVar39);
  auVar51 = vmulpd_avx512f(auVar51,auVar39);
  auVar49 = vfmadd231pd_avx512f(auVar49,auVar43,auVar3);
  auVar50 = vfmadd231pd_avx512f(auVar50,auVar43,auVar4);
  auVar51 = vfmadd231pd_avx512f(auVar51,auVar5,auVar43);
  local_140 = vfmadd231pd_avx512f(auVar49,auVar40,auVar6);
  local_100 = vfmadd231pd_avx512f(auVar50,auVar40,auVar7);
  local_c0 = vfmadd231pd_avx512f(auVar51,auVar8,auVar40);
  local_4a8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_7c0._0_8_ = (_func_int **)0x3ff0000000000000;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_940,(Matrix3xN *)local_500,(MatrixNx3c *)local_2c0,(Scalar *)local_7c0);
  auVar26._8_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar26._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar35 = vunpcklpd_avx(auVar26,auVar72);
  auVar61._0_8_ =
       auVar35._0_8_ * auVar35._0_8_ +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1];
  auVar61._8_8_ =
       auVar35._8_8_ * auVar35._8_8_ +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar18._8_8_ = 0xbff0000000000000;
  auVar18._0_8_ = 0xbff0000000000000;
  auVar35 = vaddpd_avx512vl(auVar61,auVar18);
  auVar19._8_8_ = 0x3fe0000000000000;
  auVar19._0_8_ = 0x3fe0000000000000;
  local_8d0 = vmulpd_avx512vl(auVar35,auVar19);
  dVar52 = local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  auVar35 = vunpcklpd_avx(auVar74,auVar72);
  auVar20._8_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar20._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar35 = vmulpd_avx512vl(auVar35,auVar20);
  local_8e0._0_8_ =
       auVar35._0_8_ +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  local_8e0._8_8_ =
       auVar35._8_8_ +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar52;
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] + -1.0) * 0.5;
  if (this->m_damping_enabled == true) {
    local_890 = auVar77;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_7c0);
    local_880._0_8_ = 0.0;
    local_880._8_8_ = 0.0;
    local_880._16_8_ = 0.0;
    local_880._24_8_ = 0.0;
    local_880._32_8_ = 0.0;
    _auStack_858 = ZEXT1632(ZEXT816(0));
    local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_880,(Matrix3xN *)local_7c0,
               (Matrix<double,_24,_3,_0,_24,_3> *)local_2c0,(Scalar *)&local_838);
    auVar30._8_8_ = local_880._24_8_;
    auVar30._0_8_ = local_880._16_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_858._0_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dStack_840;
    auVar81._8_8_ = 0;
    auVar81._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar35 = vunpcklpd_avx(auVar30,auVar79);
    auVar27._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar27._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar9 = vunpcklpd_avx(auVar27,auVar78);
    auVar65._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * (double)local_880._0_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * (double)local_880._8_8_ + auVar9._0_8_ * auVar35._0_8_;
    auVar65._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] * (double)local_880._24_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] * (double)local_880._32_8_ + auVar9._8_8_ * auVar35._8_8_;
    auVar75._8_8_ = this->m_Alpha;
    auVar75._0_8_ = this->m_Alpha;
    local_8d0 = vfmadd231pd_fma(local_8d0,auVar75,auVar65);
    auVar35 = vunpcklpd_avx(auVar82,auVar79);
    auVar21._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar21._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar36 = vmulpd_avx512vl(auVar35,auVar21);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_890._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] * (double)auStack_858._8_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] * dStack_848 +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] * dStack_840;
    auVar9 = vfmadd213sd_fma(auVar80,auVar75,auVar15);
    auVar35 = vunpcklpd_avx(auVar81,auVar78);
    auVar22._8_8_ = local_880._16_8_;
    auVar22._0_8_ = local_880._16_8_;
    auVar37 = vmulpd_avx512vl(auVar35,auVar22);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar52;
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         (double)local_880._24_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (double)local_880._32_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (double)auStack_858._0_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] * (double)auStack_858._8_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] * dStack_848 +
         dStack_840 *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar35 = vfmadd213sd_fma(auVar83,auVar75,auVar16);
    auVar53._0_8_ =
         (double)local_880._0_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (double)local_880._8_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] + auVar37._0_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * (double)auStack_858._8_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * dStack_848 + auVar36._0_8_;
    auVar53._8_8_ =
         (double)local_880._0_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         (double)local_880._8_8_ *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar37._8_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * (double)local_880._24_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * (double)local_880._32_8_ + auVar36._8_8_;
    local_8e0 = vfmadd231pd_fma(local_8e0,auVar75,auVar53);
    local_950 = vunpcklpd_avx(auVar9,auVar35);
  }
  else {
    local_950 = vunpcklpd_avx(auVar77,auVar64);
  }
  pLVar33 = (this->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)pLVar33[lVar34].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  this_00 = (ChElementShellANCF_3833 *)
            pLVar33[lVar34].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (ChElementShellANCF_3833 *)0x0) {
    this_00 = (ChElementShellANCF_3833 *)local_7c0;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar31 = (ChKblockGeneric *)
                ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock + 1;
      UNLOCK();
    }
    else {
      pCVar31 = (ChKblockGeneric *)
                ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock + 1;
    }
    memcpy(local_7c0,(void *)(lVar17 + 0x20),0x120);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    pLVar33 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  RotateReorderStiffnessMatrix
            (this_00,(ChMatrixNM<double,_6,_6> *)local_7c0,pLVar33[lVar34].m_theta);
  pdVar32 = (double *)(local_7c0 + 0x20);
  lVar34 = 0;
  do {
    pdVar1 = pdVar32 + -2;
    pdVar23 = pdVar32 + -1;
    dVar52 = *pdVar32;
    pdVar24 = pdVar32 + 1;
    pdVar2 = pdVar32 + -4;
    pdVar25 = pdVar32 + -3;
    pdVar32 = pdVar32 + 6;
    dVar52 = (double)local_8d0._0_8_ * *pdVar2 +
             (double)local_950._0_8_ * *pdVar1 + (double)local_8e0._0_8_ * dVar52;
    dVar60 = (double)local_8d0._8_8_ * *pdVar25 +
             (double)local_950._8_8_ * *pdVar23 + (double)local_8e0._8_8_ * *pdVar24;
    auVar54._0_8_ = dVar52 + dVar60;
    auVar54._8_8_ = dVar52 + dVar60;
    dVar52 = (double)vmovlpd_avx(auVar54);
    local_8c0[lVar34] = dVar52;
    lVar34 = lVar34 + 1;
  } while (lVar34 != 6);
  local_7e8 = local_880;
  auVar68._8_8_ = local_8c0[2];
  auVar68._0_8_ = local_8c0[2];
  auVar68._16_8_ = local_8c0[2];
  auVar68._24_8_ = local_8c0[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_880._0_8_ = local_8c0[0];
  local_880._32_8_ = local_8c0[1];
  auVar28._8_8_ = local_8c0[4];
  auVar28._0_8_ = local_8c0[3];
  auVar29._8_8_ = local_8c0[5];
  auVar29._0_8_ = local_8c0[4];
  auVar35 = vunpcklpd_avx(auVar28,auVar29);
  auVar68 = vblendpd_avx(ZEXT1632(auVar35),auVar68,8);
  _auStack_858 = vpermpd_avx2(auVar68,0xc4);
  auVar35 = vshufpd_avx(auVar29,auVar29,1);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  local_880._8_8_ = auVar35._0_8_;
  local_880._16_8_ = auVar35._8_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar35 = vfmsub231sd_fma(auVar66,auVar76,auVar62);
  local_880._24_8_ = local_8c0[5];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar9 = vfmsub231sd_fma(auVar73,auVar55,auVar62);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar36 = vfmsub231sd_fma(auVar56,auVar76,auVar69);
  local_7d0 = auVar36._0_8_ *
              local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] +
              (auVar9._0_8_ *
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] -
              auVar35._0_8_ *
              local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3]);
  local_7f0 = &local_940;
  local_7e0 = &local_940;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (&local_838,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_7f0);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) *
       (local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar35 = vfmadd231sd_fma(auVar57,auVar70,auVar70);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar35 = vfmadd213sd_fma(auVar63,auVar63,auVar35);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar9 = vfmadd231sd_fma(auVar71,auVar58,auVar58);
  auVar9 = vfmadd231sd_fma(auVar9,auVar67,auVar67);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar9._0_8_ * 3.0;
  auVar35 = vfmadd231sd_fma(auVar59,auVar35,ZEXT816(0x3fe0000000000000));
  if (auVar35._0_8_ < 0.0) {
    dVar52 = sqrt(auVar35._0_8_);
  }
  else {
    auVar35 = vsqrtsd_avx(auVar35,auVar35);
    dVar52 = auVar35._0_8_;
  }
  return dVar52;
}

Assistant:

double ChElementShellANCF_3833::GetVonMissesStress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}